

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,4,1,0,4,1>,Eigen::internal::AllRange<_1>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>
               *src,assign_op<double,_double> *func)

{
  ulong cols;
  double *pdVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  cols = (src->m_colIndices).m_size.m_value;
  pdVar1 = (src->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar2 = (src->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 4
      ) && ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
            == cols)) {
    bVar8 = true;
    lVar3 = 4;
    uVar6 = cols;
  }
  else {
    if ((long)cols < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if (cols >> 0x3d != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::random_device::_M_fini;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * 4,4,cols);
    lVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    uVar6 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
    bVar8 = lVar3 == 4;
  }
  if ((bVar8) && (uVar6 == cols)) {
    if (0 < (long)cols) {
      pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar6 = 0;
      do {
        if (0 < lVar3) {
          lVar7 = 0;
          do {
            if (lVar7 == 4) {
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0xa3,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, 4, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<int, 4, 1>, Level = 0]"
                           );
            }
            pdVar5[lVar7] =
                 pdVar1[uVar6 * lVar2 +
                        (long)(src->m_rowIndices).
                              super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[lVar7]];
            lVar7 = lVar7 + 1;
          } while (lVar3 != lVar7);
        }
        uVar6 = uVar6 + 1;
        pdVar5 = pdVar5 + lVar3;
      } while (uVar6 != cols);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::IndexedView<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<int, 4, 1>, Eigen::internal::AllRange<-1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}